

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O0

void __thiscall
TPZHCurlEquationFilter<std::complex<double>_>::UpdateEdgeAndFaceStatus
          (TPZHCurlEquationFilter<std::complex<double>_> *this,int64_t *remEdge)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  reference piVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  int iface_1;
  iterator __end0_2;
  iterator __begin0_2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  int iedge_1;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1_1;
  int iedge;
  iterator __end0_1;
  iterator __begin0_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  FaceStatusType status;
  int iface;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> blockedEdges;
  size_t in_stack_00000298;
  char *in_stack_000002a0;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe78;
  mapped_type *in_stack_fffffffffffffe80;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe98;
  mapped_type *in_stack_fffffffffffffeb8;
  mapped_type *in_stack_fffffffffffffec0;
  _Self local_110;
  _Self local_108;
  long local_100;
  set<int,_std::less<int>,_std::allocator<int>_> *local_f8;
  int local_ec;
  _Self local_e8;
  _Self local_e0;
  undefined1 *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  long local_c0;
  long local_b8;
  int local_ac;
  _Self local_a8;
  _Self local_a0;
  long local_98;
  set<int,_std::less<int>,_std::allocator<int>_> *local_90;
  long local_88;
  long local_80;
  long local_78;
  FaceStatusType local_70;
  int local_6c;
  _Self local_68;
  _Self local_60 [3];
  set<int,_std::less<int>,_std::allocator<int>_> *local_48;
  undefined1 local_40 [64];
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1c25fe1);
  pmVar2 = std::
           map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
           ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                         *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
  local_48 = &pmVar2->face_connect;
  local_60[0]._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe78);
  local_68._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe78);
  do {
    bVar1 = std::operator!=(local_60,&local_68);
    if (!bVar1) {
      local_d8 = local_40;
      local_e0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe78);
      local_e8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe78);
      while (bVar1 = std::operator!=(&local_e0,&local_e8), bVar1) {
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x1c26361);
        local_ec = *piVar4;
        local_100 = (long)local_ec;
        pmVar2 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                 ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                               *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
        local_f8 = &pmVar2->face_connect;
        local_108._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe78);
        local_110._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe78);
        while (bVar1 = std::operator!=(&local_108,&local_110), bVar1) {
          std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1c263f4);
          in_stack_fffffffffffffe80 =
               std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                             *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
          in_stack_fffffffffffffe80->status = EFortunateFace;
          std::_Rb_tree_const_iterator<int>::operator++
                    ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe80);
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe80);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1c2645a);
      return;
    }
    piVar4 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1c26064)
    ;
    local_6c = *piVar4;
    local_78 = (long)local_6c;
    pmVar3 = std::
             map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
             ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                           *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
    local_70 = pmVar3->status;
    if (local_70 == EFreeFace) {
      local_80 = (long)local_6c;
      in_stack_fffffffffffffec0 =
           std::
           map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
           ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                         *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
      in_stack_fffffffffffffec0->status = ECryticalFace;
    }
    else if ((local_70 == ECryticalFace) || (local_70 == EFortunateFace)) {
      local_88 = (long)local_6c;
      in_stack_fffffffffffffeb8 =
           std::
           map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
           ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                         *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
      in_stack_fffffffffffffeb8->status = EBlockedFace;
      local_98 = (long)local_6c;
      pmVar3 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                             *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
      local_90 = &pmVar3->edge_connect;
      local_a0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe78);
      local_a8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe78);
      while (bVar1 = std::operator!=(&local_a0,&local_a8), bVar1) {
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x1c261fb);
        local_ac = *piVar4;
        local_b8 = (long)local_ac;
        pmVar2 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                 ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                               *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
        if (pmVar2->status == EFreeEdge) {
          local_c0 = (long)local_ac;
          pmVar2 = std::
                   map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                   ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                                 *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->index);
          pmVar2->status = EBlockedEdge;
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)pmVar2,
                             (value_type_conflict4 *)in_stack_fffffffffffffe98._M_node);
          in_stack_fffffffffffffe98 = pVar5.first._M_node;
          local_c8 = pVar5.second;
          local_d0 = in_stack_fffffffffffffe98._M_node;
          break;
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe80);
      }
    }
    else if (local_70 == EBlockedFace) {
      pzinternal::DebugStopImpl(in_stack_000002a0,in_stack_00000298);
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe80);
  } while( true );
}

Assistant:

void TPZHCurlEquationFilter<TVar>::UpdateEdgeAndFaceStatus(int64_t &remEdge)
{
    std::set<int> blockedEdges;

    //Look at the faces where the removed edge is a part of and updates its status
    for (auto iface : mEdge[remEdge].face_connect)
    {
        auto status = mFace[iface].status;
        if (status == EFreeFace){
            mFace[iface].status = ECryticalFace;
        } else if (status == ECryticalFace || status == EFortunateFace) { // here there is a ?
            mFace[iface].status = EBlockedFace;

            //Loops over the edges of a face. If it is a free edge, then block it
            for (auto iedge : mFace[iface].edge_connect){
                if (mEdge[iedge].status == EFreeEdge){
                    mEdge[iedge].status = EBlockedEdge;
                    blockedEdges.insert(iedge);
                    break;
                }
            }
        } else if (status == EBlockedFace){
            DebugStop();
        } 
    }//iface

    // Now we can update all the faces in the mesh, as we can have some blocked 
    // edges and it will produce fortunate faces.
    for (auto iedge : blockedEdges)
    {
        for (auto iface : mEdge[iedge].face_connect){
            mFace[iface].status = EFortunateFace;
        }
    }    
}